

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void vec_add_internal(void *v,void *elem)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  undefined4 local_24;
  int nl;
  int l;
  AbstractVec *av;
  void *elem_local;
  void *v_local;
  
  if (*v == 0) {
    *(long *)((long)v + 8) = (long)v + 0x10;
  }
  else if (*(long *)((long)v + 8) == (long)v + 0x10) {
    pvVar3 = malloc(0x40);
    *(void **)((long)v + 8) = pvVar3;
    memcpy(*(void **)((long)v + 8),(void *)((long)v + 0x10),(ulong)*v << 3);
  }
  else if ((*v & 7) == 0) {
    bVar1 = 4;
    local_24 = *v >> 3;
    while (uVar2 = local_24 & 1, local_24 = (int)local_24 >> 1, uVar2 == 0) {
      bVar1 = bVar1 + 1;
    }
    if ((*v == 0) || (local_24 == 0)) {
      pvVar3 = realloc(*(void **)((long)v + 8),(long)(1 << (bVar1 & 0x1f)) << 3);
      *(void **)((long)v + 8) = pvVar3;
    }
  }
  *(void **)(*(long *)((long)v + 8) + (ulong)*v * 8) = elem;
  *(int *)v = *v + 1;
  return;
}

Assistant:

void vec_add_internal(void *v, void *elem) {
  AbstractVec *av = (AbstractVec *)v;
  if (!av->n) {
    av->v = av->e;
  } else if (av->v == av->e) {
    av->v = (void **)MALLOC(INITIAL_VEC_SIZE * sizeof(void *));
    memcpy(av->v, av->e, av->n * sizeof(void *));
  } else {
    if ((av->n & (INITIAL_VEC_SIZE - 1)) == 0) {
      int l = av->n, nl = (1 + INITIAL_VEC_SHIFT);
      l = l >> INITIAL_VEC_SHIFT;
      while (!(l & 1)) {
        l = l >> 1;
        nl++;
      }
      l = l >> 1;
      if (!av->n || !l) {
        nl = 1 << nl;
        av->v = (void **)REALLOC(av->v, nl * sizeof(void *));
      }
    }
  }
  av->v[av->n] = elem;
  av->n++;
}